

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpointer.c
# Opt level: O3

void xmlXPtrRangeFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlXPathObjectType xVar1;
  xmlElementType xVar2;
  int *piVar3;
  int *piVar4;
  xmlGenericErrorFunc p_Var5;
  xmlXPathObjectPtr pxVar6;
  xmlXPathObjectPtr obj;
  xmlLocationSetPtr cur;
  xmlGenericErrorFunc *pp_Var7;
  void **ppvVar8;
  xmlDocPtr pxVar9;
  _xmlNode *p_Var10;
  int i;
  int iVar11;
  xmlDocPtr pxVar12;
  int iVar13;
  xmlDocPtr cur_00;
  long lVar14;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs != 1) {
    iVar13 = 0xc;
    goto LAB_001eaf17;
  }
  if (ctxt->valueNr <= ctxt->valueFrame) {
    iVar13 = 0x17;
    goto LAB_001eaf17;
  }
  if ((ctxt->value == (xmlXPathObjectPtr)0x0) ||
     ((xVar1 = ctxt->value->type, xVar1 != XPATH_NODESET && (xVar1 != XPATH_LOCATIONSET)))) {
    iVar13 = 0xb;
    goto LAB_001eaf17;
  }
  pxVar6 = valuePop(ctxt);
  obj = pxVar6;
  if (pxVar6->type == XPATH_NODESET) {
    obj = xmlXPtrNewLocationSetNodeSet(pxVar6->nodesetval);
    xmlXPathFreeObject(pxVar6);
    if (obj != (xmlXPathObjectPtr)0x0) goto LAB_001ead09;
  }
  else {
LAB_001ead09:
    piVar3 = (int *)obj->user;
    cur = (xmlLocationSetPtr)(*xmlMalloc)(0x10);
    if (cur != (xmlLocationSetPtr)0x0) {
      cur->locNr = 0;
      cur->locMax = 0;
      cur->locTab = (xmlXPathObjectPtr *)0x0;
      if ((piVar3 != (int *)0x0) && (0 < *piVar3)) {
        lVar14 = 0;
        do {
          piVar4 = *(int **)(*(long *)(piVar3 + 2) + lVar14 * 8);
          if (((piVar4 == (int *)0x0) || (ctxt->context == (xmlXPathContextPtr)0x0)) ||
             (pxVar9 = ctxt->context->doc, pxVar9 == (xmlDocPtr)0x0)) {
LAB_001eadc1:
            pxVar6 = (xmlXPathObjectPtr)0x0;
          }
          else {
            if (*piVar4 == 6) {
              cur_00 = *(xmlDocPtr *)(piVar4 + 10);
              if (*(xmlDocPtr *)(piVar4 + 0xe) == (xmlDocPtr)0x0) {
                pxVar12 = cur_00;
                if (cur_00 == pxVar9) {
                  iVar11 = xmlXPtrGetArity((xmlNodePtr)cur_00);
                  iVar13 = 0;
                }
                else {
                  xVar2 = cur_00->type;
                  if (XML_HTML_DOCUMENT_NODE < xVar2) goto LAB_001eadc1;
                  if ((0x33baU >> (xVar2 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0) {
                    pxVar6 = (xmlXPathObjectPtr)0x0;
                    if (xVar2 != XML_ATTRIBUTE_NODE) goto LAB_001eadc3;
                    iVar11 = 0;
                    for (p_Var10 = cur_00->children; p_Var10 != (_xmlNode *)0x0;
                        p_Var10 = p_Var10->next) {
                      if ((p_Var10->type < XML_DTD_NODE) &&
                         ((0x2202U >> (p_Var10->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1)
                          != 0)) {
                        iVar11 = iVar11 + 1;
                      }
                    }
                    iVar13 = 0;
                  }
                  else {
                    iVar11 = 1;
                    pxVar9 = cur_00;
                    do {
                      if ((pxVar9->type < XML_DTD_NODE) &&
                         ((0x2202U >> (pxVar9->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) !=
                          0)) {
                        iVar11 = iVar11 + 1;
                      }
                      pxVar9 = (xmlDocPtr)pxVar9->prev;
                    } while (pxVar9 != (xmlDocPtr)0x0);
                    cur_00 = (xmlDocPtr)cur_00->parent;
                    iVar13 = iVar11 + -1;
                    iVar11 = iVar11 + 1;
                    pxVar12 = cur_00;
                  }
                }
              }
              else {
                iVar13 = piVar4[0xc];
                iVar11 = piVar4[0x10];
                pxVar12 = *(xmlDocPtr *)(piVar4 + 0xe);
              }
            }
            else {
              if (*piVar4 != 5) {
                pp_Var7 = __xmlGenericError();
                p_Var5 = *pp_Var7;
                ppvVar8 = __xmlGenericErrorContext();
                (*p_Var5)(*ppvVar8,"Unimplemented block at %s:%d\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JFLarvoire[P]libxml2/xpointer.c"
                          ,0x7d5);
                goto LAB_001eadc1;
              }
              cur_00 = *(xmlDocPtr *)(piVar4 + 10);
              iVar11 = piVar4[0xc];
              pxVar12 = cur_00;
              iVar13 = iVar11;
            }
            pxVar6 = xmlXPtrNewRange((xmlNodePtr)cur_00,iVar13,(xmlNodePtr)pxVar12,iVar11);
          }
LAB_001eadc3:
          xmlXPtrLocationSetAdd(cur,pxVar6);
          lVar14 = lVar14 + 1;
        } while (lVar14 < *piVar3);
      }
      pxVar6 = (xmlXPathObjectPtr)(*xmlMalloc)(0x48);
      if (pxVar6 == (xmlXPathObjectPtr)0x0) {
        xmlXPtrErrMemory("allocating locationset");
      }
      else {
        *(undefined8 *)pxVar6 = 0;
        pxVar6->nodesetval = (xmlNodeSetPtr)0x0;
        pxVar6->stringval = (xmlChar *)0x0;
        pxVar6->user = (void *)0x0;
        *(undefined8 *)&pxVar6->index = 0;
        pxVar6->user2 = (void *)0x0;
        *(undefined8 *)&pxVar6->boolval = 0;
        pxVar6->floatval = 0.0;
        *(undefined8 *)&pxVar6->index2 = 0;
        pxVar6->type = XPATH_LOCATIONSET;
        pxVar6->user = cur;
      }
      valuePush(ctxt,pxVar6);
      xmlXPathFreeObject(obj);
      return;
    }
    xmlXPtrErrMemory("allocating locationset");
    xmlXPathFreeObject(obj);
  }
  iVar13 = 0xf;
LAB_001eaf17:
  xmlXPathErr(ctxt,iVar13);
  return;
}

Assistant:

static void
xmlXPtrRangeFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    int i;
    xmlXPathObjectPtr set;
    xmlLocationSetPtr oldset;
    xmlLocationSetPtr newset;

    CHECK_ARITY(1);
    if ((ctxt->value == NULL) ||
	((ctxt->value->type != XPATH_LOCATIONSET) &&
	 (ctxt->value->type != XPATH_NODESET)))
        XP_ERROR(XPATH_INVALID_TYPE)

    set = valuePop(ctxt);
    if (set->type == XPATH_NODESET) {
	xmlXPathObjectPtr tmp;

	/*
	 * First convert to a location set
	 */
	tmp = xmlXPtrNewLocationSetNodeSet(set->nodesetval);
	xmlXPathFreeObject(set);
	if (tmp == NULL)
            XP_ERROR(XPATH_MEMORY_ERROR)
	set = tmp;
    }
    oldset = (xmlLocationSetPtr) set->user;

    /*
     * The loop is to compute the covering range for each item and add it
     */
    newset = xmlXPtrLocationSetCreate(NULL);
    if (newset == NULL) {
	xmlXPathFreeObject(set);
        XP_ERROR(XPATH_MEMORY_ERROR);
    }
    if (oldset != NULL) {
        for (i = 0;i < oldset->locNr;i++) {
            xmlXPtrLocationSetAdd(newset,
                    xmlXPtrCoveringRange(ctxt, oldset->locTab[i]));
        }
    }

    /*
     * Save the new value and cleanup
     */
    valuePush(ctxt, xmlXPtrWrapLocationSet(newset));
    xmlXPathFreeObject(set);
}